

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::
format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
::on_replacement_field
          (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
           *this,char *p)

{
  arg_formatter<fmt::v6::buffer_range<char>_> local_48;
  buffer<char> *local_20;
  char *local_18;
  char *p_local;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
  *this_local;
  
  local_18 = p;
  p_local = (char *)this;
  advance_to<char,fmt::v6::detail::error_handler>(&this->parse_context,p);
  arg_formatter<fmt::v6::buffer_range<char>_>::arg_formatter
            (&local_48,&this->context,&this->parse_context,(format_specs *)0x0);
  local_20 = (buffer<char> *)
             visit_format_arg<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>
                       (&local_48,&this->arg);
  basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>::advance_to
            (&this->context,(iterator)local_20);
  return;
}

Assistant:

void on_replacement_field(const Char* p) {
    advance_to(parse_context, p);
    context.advance_to(
        visit_format_arg(ArgFormatter(context, &parse_context), arg));
  }